

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* httplib::detail::make_digest_authentication_header
            (Request *req,
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *auth,size_t cnonce_count,string *cnonce,string *username,string *password,bool is_proxy
            )

{
  code *pcVar1;
  bool bVar2;
  ostream *poVar3;
  void *this;
  long lVar4;
  mapped_type *pmVar5;
  ulong uVar6;
  pair<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *__p;
  ulong in_RCX;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_RDX;
  long in_RSI;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_RDI;
  byte in_stack_00000010;
  char *key;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> field;
  mapped_type opaque;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> A2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> A1;
  _func_string_string_ptr *H;
  string response;
  string algo;
  string qop;
  stringstream ss;
  string nc;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffff358;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff360;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff368;
  key_type *in_stack_fffffffffffff378;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffff380;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff388;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff390;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff398;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff3a0;
  mapped_type *in_stack_fffffffffffff3a8;
  code *local_bd0;
  code *local_bc8;
  bool local_ac9;
  string local_ac8 [38];
  byte local_aa2;
  undefined1 local_aa1 [36];
  byte local_a7d;
  byte local_a7c;
  byte local_a7b;
  byte local_a7a;
  byte local_a79;
  string local_a78 [32];
  string local_a58 [32];
  string local_a38 [32];
  string local_a18 [32];
  string local_9f8 [38];
  byte local_9d2;
  undefined1 local_9d1 [40];
  undefined1 local_9a9 [40];
  undefined1 local_981 [33];
  string local_960 [32];
  string local_940 [32];
  string local_920 [32];
  string local_900 [32];
  string local_8e0 [32];
  string local_8c0 [32];
  string local_8a0 [32];
  string local_880 [32];
  string local_860 [32];
  string local_840 [32];
  string local_820 [32];
  string local_800 [32];
  string local_7e0 [35];
  byte local_7bd;
  undefined1 local_7bc [4];
  string local_7b8 [32];
  _Self local_798;
  allocator<char> local_789;
  string local_788 [32];
  _Self local_768;
  string local_760 [32];
  string local_740 [39];
  allocator<char> local_719;
  string local_718 [32];
  string local_6f8 [32];
  string local_6d8 [32];
  string local_6b8 [32];
  string local_698 [32];
  string local_678 [32];
  string local_658 [32];
  string local_638 [32];
  string local_618 [32];
  string local_5f8 [32];
  string local_5d8 [32];
  string local_5b8 [32];
  string local_598 [32];
  string local_578 [39];
  allocator<char> local_551;
  string local_550 [32];
  string local_530 [32];
  string local_510 [32];
  string local_4f0 [32];
  string local_4d0 [32];
  string local_4b0 [32];
  string local_490 [32];
  string local_470 [32];
  string local_450 [32];
  string local_430 [32];
  string local_410 [39];
  allocator<char> local_3e9;
  string local_3e8 [32];
  string local_3c8 [32];
  string local_3a8 [32];
  string local_388 [32];
  string local_368 [32];
  code *local_348;
  string local_340 [39];
  allocator<char> local_319;
  string local_318 [32];
  _Self local_2f8;
  allocator<char> local_2e9;
  string local_2e8 [32];
  _Self local_2c8;
  allocator<char> local_2b9;
  string local_2b8 [39];
  allocator<char> local_291;
  string local_290 [32];
  _Self local_270;
  allocator<char> local_261;
  string local_260 [32];
  _Self local_240;
  string local_238 [32];
  string local_218 [36];
  int local_1f4;
  char local_1ed;
  stringstream local_1e0 [16];
  undefined1 local_1d0 [376];
  string local_58 [39];
  byte local_31;
  ulong local_20;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_18;
  long local_10;
  
  local_31 = in_stack_00000010 & 1;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::__cxx11::string::string(local_58);
  std::__cxx11::stringstream::stringstream(local_1e0);
  local_1ed = (char)std::setfill<char>('0');
  poVar3 = std::operator<<(local_1d0,local_1ed);
  local_1f4 = (int)std::setw(8);
  poVar3 = std::operator<<(poVar3,(_Setw)local_1f4);
  this = (void *)std::ostream::operator<<(poVar3,std::hex);
  std::ostream::operator<<(this,local_20);
  std::__cxx11::stringstream::str();
  std::__cxx11::string::operator=(local_58,local_218);
  std::__cxx11::string::~string(local_218);
  std::__cxx11::stringstream::~stringstream(local_1e0);
  std::__cxx11::string::string(local_238);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff3a0,(char *)in_stack_fffffffffffff398,
             (allocator<char> *)in_stack_fffffffffffff390);
  local_240._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find(in_stack_fffffffffffff358,(key_type *)0x165235);
  local_270._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end(in_stack_fffffffffffff358);
  bVar2 = std::operator!=(&local_240,&local_270);
  std::__cxx11::string::~string(local_260);
  std::allocator<char>::~allocator(&local_261);
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff3a0,(char *)in_stack_fffffffffffff398,
               (allocator<char> *)in_stack_fffffffffffff390);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::at(in_stack_fffffffffffff380,in_stack_fffffffffffff378);
    std::__cxx11::string::operator=(local_238,(string *)pmVar5);
    std::__cxx11::string::~string(local_290);
    std::allocator<char>::~allocator(&local_291);
    lVar4 = std::__cxx11::string::find((char *)local_238,0x24ec65);
    if (lVar4 == -1) {
      lVar4 = std::__cxx11::string::find((char *)local_238,0x24ec6e);
      if (lVar4 == -1) {
        std::__cxx11::string::clear();
      }
      else {
        std::__cxx11::string::operator=(local_238,"auth");
      }
    }
    else {
      std::__cxx11::string::operator=(local_238,"auth-int");
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff3a0,(char *)in_stack_fffffffffffff398,
             (allocator<char> *)in_stack_fffffffffffff390);
  std::allocator<char>::~allocator(&local_2b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff3a0,(char *)in_stack_fffffffffffff398,
             (allocator<char> *)in_stack_fffffffffffff390);
  local_2c8._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find(in_stack_fffffffffffff358,(key_type *)0x165543);
  local_2f8._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end(in_stack_fffffffffffff358);
  bVar2 = std::operator!=(&local_2c8,&local_2f8);
  std::__cxx11::string::~string(local_2e8);
  std::allocator<char>::~allocator(&local_2e9);
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff3a0,(char *)in_stack_fffffffffffff398,
               (allocator<char> *)in_stack_fffffffffffff390);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::at(in_stack_fffffffffffff380,in_stack_fffffffffffff378);
    std::__cxx11::string::operator=(local_2b8,(string *)pmVar5);
    std::__cxx11::string::~string(local_318);
    std::allocator<char>::~allocator(&local_319);
  }
  std::__cxx11::string::string(local_340);
  bVar2 = std::operator==(in_stack_fffffffffffff360,(char *)in_stack_fffffffffffff358);
  if (bVar2) {
    local_bc8 = SHA_256;
  }
  else {
    bVar2 = std::operator==(in_stack_fffffffffffff360,(char *)in_stack_fffffffffffff358);
    if (bVar2) {
      local_bd0 = SHA_512;
    }
    else {
      local_bd0 = MD5;
    }
    local_bc8 = local_bd0;
  }
  local_348 = local_bc8;
  std::operator+(in_stack_fffffffffffff388,(char *)in_stack_fffffffffffff380);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff3a0,(char *)in_stack_fffffffffffff398,
             (allocator<char> *)in_stack_fffffffffffff390);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::at(in_stack_fffffffffffff380,in_stack_fffffffffffff378);
  std::operator+(in_stack_fffffffffffff368,in_stack_fffffffffffff360);
  std::operator+(in_stack_fffffffffffff368,(char *)in_stack_fffffffffffff360);
  std::operator+(in_stack_fffffffffffff368,in_stack_fffffffffffff360);
  std::__cxx11::string::~string(local_388);
  std::__cxx11::string::~string(local_3a8);
  std::__cxx11::string::~string(local_3e8);
  std::allocator<char>::~allocator(&local_3e9);
  std::__cxx11::string::~string(local_3c8);
  std::operator+(in_stack_fffffffffffff388,(char *)in_stack_fffffffffffff380);
  std::operator+(in_stack_fffffffffffff368,in_stack_fffffffffffff360);
  std::__cxx11::string::~string(local_430);
  bVar2 = std::operator==(in_stack_fffffffffffff360,(char *)in_stack_fffffffffffff358);
  if (bVar2) {
    (*local_348)(local_470,local_10 + 0x70);
    std::operator+((char *)in_stack_fffffffffffff368,in_stack_fffffffffffff360);
    std::__cxx11::string::operator+=(local_410,local_450);
    std::__cxx11::string::~string(local_450);
    std::__cxx11::string::~string(local_470);
  }
  uVar6 = std::__cxx11::string::empty();
  pcVar1 = local_348;
  if ((uVar6 & 1) == 0) {
    (*local_348)(local_6f8,local_368);
    std::operator+(in_stack_fffffffffffff368,(char *)in_stack_fffffffffffff360);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff3a0,(char *)in_stack_fffffffffffff398,
               (allocator<char> *)in_stack_fffffffffffff390);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::at(in_stack_fffffffffffff380,in_stack_fffffffffffff378);
    std::operator+(in_stack_fffffffffffff368,in_stack_fffffffffffff360);
    std::operator+(in_stack_fffffffffffff368,(char *)in_stack_fffffffffffff360);
    std::operator+(in_stack_fffffffffffff368,in_stack_fffffffffffff360);
    std::operator+(in_stack_fffffffffffff368,(char *)in_stack_fffffffffffff360);
    std::operator+(in_stack_fffffffffffff368,in_stack_fffffffffffff360);
    std::operator+(in_stack_fffffffffffff368,(char *)in_stack_fffffffffffff360);
    std::operator+(in_stack_fffffffffffff368,in_stack_fffffffffffff360);
    std::operator+(in_stack_fffffffffffff368,(char *)in_stack_fffffffffffff360);
    (*local_348)(local_740,local_410);
    std::operator+(in_stack_fffffffffffff398,in_stack_fffffffffffff390);
    (*pcVar1)(local_598,local_5b8);
    std::__cxx11::string::operator=(local_340,local_598);
    std::__cxx11::string::~string(local_598);
    std::__cxx11::string::~string(local_5b8);
    std::__cxx11::string::~string(local_740);
    std::__cxx11::string::~string(local_5d8);
    std::__cxx11::string::~string(local_5f8);
    std::__cxx11::string::~string(local_618);
    std::__cxx11::string::~string(local_638);
    std::__cxx11::string::~string(local_658);
    std::__cxx11::string::~string(local_678);
    std::__cxx11::string::~string(local_698);
    std::__cxx11::string::~string(local_6b8);
    std::__cxx11::string::~string(local_718);
    std::allocator<char>::~allocator(&local_719);
    std::__cxx11::string::~string(local_6d8);
    std::__cxx11::string::~string(local_6f8);
  }
  else {
    (*local_348)(local_530,local_368);
    std::operator+(in_stack_fffffffffffff368,(char *)in_stack_fffffffffffff360);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff3a0,(char *)in_stack_fffffffffffff398,
               (allocator<char> *)in_stack_fffffffffffff390);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::at(in_stack_fffffffffffff380,in_stack_fffffffffffff378);
    std::operator+(in_stack_fffffffffffff368,in_stack_fffffffffffff360);
    std::operator+(in_stack_fffffffffffff368,(char *)in_stack_fffffffffffff360);
    (*local_348)(local_578,local_410);
    std::operator+(in_stack_fffffffffffff398,in_stack_fffffffffffff390);
    (*pcVar1)(local_490,local_4b0);
    std::__cxx11::string::operator=(local_340,local_490);
    std::__cxx11::string::~string(local_490);
    std::__cxx11::string::~string(local_4b0);
    std::__cxx11::string::~string(local_578);
    std::__cxx11::string::~string(local_4d0);
    std::__cxx11::string::~string(local_4f0);
    std::__cxx11::string::~string(local_550);
    std::allocator<char>::~allocator(&local_551);
    std::__cxx11::string::~string(local_510);
    std::__cxx11::string::~string(local_530);
  }
  std::__cxx11::string::~string(local_410);
  std::__cxx11::string::~string(local_368);
  std::allocator<char>::allocator();
  local_7bc[2] = 0;
  local_7bc[1] = 0;
  local_7bd = 0;
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff3a0,(char *)in_stack_fffffffffffff398,
             (allocator<char> *)in_stack_fffffffffffff390);
  local_768._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find(in_stack_fffffffffffff358,(key_type *)0x166315);
  local_798._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end(in_stack_fffffffffffff358);
  bVar2 = std::operator!=(&local_768,&local_798);
  if (bVar2) {
    std::allocator<char>::allocator();
    local_7bc[2] = 1;
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff3a0,(char *)in_stack_fffffffffffff398,
               (allocator<char> *)in_stack_fffffffffffff390);
    local_7bc[1] = 1;
    in_stack_fffffffffffff3a8 =
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::at(in_stack_fffffffffffff380,in_stack_fffffffffffff378);
    std::__cxx11::string::string(local_760,(string *)in_stack_fffffffffffff3a8);
  }
  else {
    in_stack_fffffffffffff3a0 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_7bc;
    std::allocator<char>::allocator();
    local_7bd = 1;
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff3a0,(char *)in_stack_fffffffffffff398,
               (allocator<char> *)in_stack_fffffffffffff390);
  }
  if ((local_7bd & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)local_7bc);
  }
  if ((local_7bc[1] & 1) != 0) {
    std::__cxx11::string::~string(local_7b8);
  }
  if ((local_7bc[2] & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)(local_7bc + 3));
  }
  std::__cxx11::string::~string(local_788);
  std::allocator<char>::~allocator(&local_789);
  std::operator+((char *)in_stack_fffffffffffff3a8,in_stack_fffffffffffff3a0);
  std::operator+(in_stack_fffffffffffff368,(char *)in_stack_fffffffffffff360);
  __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_981;
  this_01 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff3a0,(char *)__lhs,(allocator<char> *)this_01);
  __p = (pair<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::at(in_stack_fffffffffffff380,in_stack_fffffffffffff378);
  std::operator+(in_stack_fffffffffffff368,in_stack_fffffffffffff360);
  std::operator+(in_stack_fffffffffffff368,(char *)in_stack_fffffffffffff360);
  this_00 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)local_9a9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff3a0,(char *)__lhs,(allocator<char> *)this_01);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::at(this_00,&local_18->first);
  std::operator+(in_stack_fffffffffffff368,in_stack_fffffffffffff360);
  std::operator+(in_stack_fffffffffffff368,(char *)in_stack_fffffffffffff360);
  std::operator+(in_stack_fffffffffffff368,in_stack_fffffffffffff360);
  std::operator+(in_stack_fffffffffffff368,(char *)in_stack_fffffffffffff360);
  std::operator+(in_stack_fffffffffffff368,in_stack_fffffffffffff360);
  uVar6 = std::__cxx11::string::empty();
  local_9d2 = 0;
  local_a79 = 0;
  local_a7a = 0;
  local_a7b = 0;
  local_a7c = 0;
  local_a7d = 0;
  if ((uVar6 & 1) == 0) {
    std::operator+((char *)in_stack_fffffffffffff3a8,in_stack_fffffffffffff3a0);
    local_a79 = 1;
    std::operator+(in_stack_fffffffffffff368,(char *)in_stack_fffffffffffff360);
    local_a7a = 1;
    std::operator+(in_stack_fffffffffffff368,in_stack_fffffffffffff360);
    local_a7b = 1;
    std::operator+(in_stack_fffffffffffff368,(char *)in_stack_fffffffffffff360);
    local_a7c = 1;
    std::operator+(in_stack_fffffffffffff368,in_stack_fffffffffffff360);
    local_a7d = 1;
    std::operator+(in_stack_fffffffffffff368,(char *)in_stack_fffffffffffff360);
  }
  else {
    in_stack_fffffffffffff368 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_9d1;
    std::allocator<char>::allocator();
    local_9d2 = 1;
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff3a0,(char *)__lhs,(allocator<char> *)this_01);
  }
  std::operator+(__lhs,&this_01->first);
  std::operator+(in_stack_fffffffffffff368,in_stack_fffffffffffff360);
  std::operator+(in_stack_fffffffffffff368,(char *)in_stack_fffffffffffff360);
  uVar6 = std::__cxx11::string::empty();
  local_aa2 = 0;
  local_ac9 = (uVar6 & 1) != 0;
  if (local_ac9) {
    in_stack_fffffffffffff360 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_aa1;
    std::allocator<char>::allocator();
    local_aa2 = 1;
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff3a0,(char *)__lhs,(allocator<char> *)this_01);
  }
  else {
    std::operator+((char *)in_stack_fffffffffffff3a8,in_stack_fffffffffffff3a0);
    std::operator+(in_stack_fffffffffffff368,(char *)in_stack_fffffffffffff360);
  }
  local_ac9 = !local_ac9;
  std::operator+(__lhs,&this_01->first);
  std::__cxx11::string::~string((string *)(local_aa1 + 1));
  if (local_ac9) {
    std::__cxx11::string::~string(local_ac8);
  }
  if ((local_aa2 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)local_aa1);
  }
  std::__cxx11::string::~string(local_800);
  std::__cxx11::string::~string(local_820);
  std::__cxx11::string::~string(local_840);
  std::__cxx11::string::~string((string *)(local_9d1 + 1));
  if ((local_a7d & 1) != 0) {
    std::__cxx11::string::~string(local_9f8);
  }
  if ((local_a7c & 1) != 0) {
    std::__cxx11::string::~string(local_a18);
  }
  if ((local_a7b & 1) != 0) {
    std::__cxx11::string::~string(local_a38);
  }
  if ((local_a7a & 1) != 0) {
    std::__cxx11::string::~string(local_a58);
  }
  if ((local_a79 & 1) != 0) {
    std::__cxx11::string::~string(local_a78);
  }
  if ((local_9d2 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)local_9d1);
  }
  std::__cxx11::string::~string(local_860);
  std::__cxx11::string::~string(local_880);
  std::__cxx11::string::~string(local_8a0);
  std::__cxx11::string::~string(local_8c0);
  std::__cxx11::string::~string(local_8e0);
  std::__cxx11::string::~string((string *)(local_9a9 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_9a9);
  std::__cxx11::string::~string(local_900);
  std::__cxx11::string::~string(local_920);
  std::__cxx11::string::~string((string *)(local_981 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_981);
  std::__cxx11::string::~string(local_940);
  std::__cxx11::string::~string(local_960);
  std::make_pair<char_const*&,std::__cxx11::string&>
            ((char **)in_stack_fffffffffffff368,in_stack_fffffffffffff360);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (this_01,__p);
  std::
  pair<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair((pair<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)0x166ab5);
  std::__cxx11::string::~string(local_7e0);
  std::__cxx11::string::~string(local_760);
  std::__cxx11::string::~string(local_340);
  std::__cxx11::string::~string(local_2b8);
  std::__cxx11::string::~string(local_238);
  std::__cxx11::string::~string(local_58);
  return in_RDI;
}

Assistant:

inline std::pair<std::string, std::string> make_digest_authentication_header(
            const Request& req, const std::map<std::string, std::string>& auth,
            size_t cnonce_count, const std::string& cnonce, const std::string& username,
            const std::string& password, bool is_proxy = false) {
            std::string nc;
            {
                std::stringstream ss;
                ss << std::setfill('0') << std::setw(8) << std::hex << cnonce_count;
                nc = ss.str();
            }

            std::string qop;
            if (auth.find("qop") != auth.end()) {
                qop = auth.at("qop");
                if (qop.find("auth-int") != std::string::npos) {
                    qop = "auth-int";
                } else if (qop.find("auth") != std::string::npos) {
                    qop = "auth";
                } else {
                    qop.clear();
                }
            }

            std::string algo = "MD5";
            if (auth.find("algorithm") != auth.end()) { algo = auth.at("algorithm"); }

            std::string response;
            {
                auto H = algo == "SHA-256" ? detail::SHA_256
                    : algo == "SHA-512" ? detail::SHA_512
                    : detail::MD5;

                auto A1 = username + ":" + auth.at("realm") + ":" + password;

                auto A2 = req.method + ":" + req.path;
                if (qop == "auth-int") { A2 += ":" + H(req.body); }

                if (qop.empty()) {
                    response = H(H(A1) + ":" + auth.at("nonce") + ":" + H(A2));
                } else {
                    response = H(H(A1) + ":" + auth.at("nonce") + ":" + nc + ":" + cnonce +
                        ":" + qop + ":" + H(A2));
                }
            }

            auto opaque = (auth.find("opaque") != auth.end()) ? auth.at("opaque") : "";

            auto field = "Digest username=\"" + username + "\", realm=\"" +
                auth.at("realm") + "\", nonce=\"" + auth.at("nonce") +
                "\", uri=\"" + req.path + "\", algorithm=" + algo +
                (qop.empty() ? ", response=\""
                    : ", qop=" + qop + ", nc=" + nc + ", cnonce=\"" +
                    cnonce + "\", response=\"") +
                response + "\"" +
                (opaque.empty() ? "" : ", opaque=\"" + opaque + "\"");

            auto key = is_proxy ? "Proxy-Authorization" : "Authorization";
            return std::make_pair(key, field);
        }